

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sumofdigits.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  istream *piVar2;
  ulong uVar3;
  char *pcVar4;
  ostream *this;
  int local_258;
  int i;
  int local_244;
  string local_240 [4];
  int sum;
  string line;
  istream local_220 [8];
  ifstream stream;
  char **argv_local;
  int argc_local;
  
  std::ifstream::ifstream(local_220,argv[1],8);
  std::__cxx11::string::string(local_240);
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_240);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    local_244 = 0;
    local_258 = 0;
    while( true ) {
      uVar3 = std::__cxx11::string::length();
      if (uVar3 <= (ulong)(long)local_258) break;
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_240);
      local_244 = *pcVar4 + -0x30 + local_244;
      local_258 = local_258 + 1;
    }
    this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_244);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_240);
  std::ifstream::~ifstream(local_220);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);

    string line;
    int sum;
    while (getline(stream, line)) {
        sum = 0;
        for(int i = 0; i < line.length(); i++){
            sum += line[i] - (int)'0';
        }
        std::cout << sum << std::endl;
    }
    return 0;
}